

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::readOutputBuffer
          (BufferIoExecutor *this,void **outputPtrs,int numValues)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deBool dVar4;
  undefined4 extraout_var;
  void *srcBasePtr;
  TestError *this_00;
  VarType *pVVar6;
  reference pvVar7;
  reference layout_00;
  VarLayout *layout;
  VarType *varType;
  size_t outputNdx;
  void *mapPtr;
  int outputBufferSize;
  deUint32 outputStride;
  deUint32 buffer;
  Functions *gl;
  int numValues_local;
  void **outputPtrs_local;
  BufferIoExecutor *this_local;
  long lVar5;
  
  iVar1 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  dVar2 = glu::ObjectWrapper::operator*(&(this->m_outputBuffer).super_ObjectWrapper);
  dVar3 = getLayoutStride(&this->m_outputLayout);
  (**(code **)(lVar5 + 0x40))(0x90d2,dVar2);
  srcBasePtr = (void *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,(long)(int)(numValues * dVar3),1);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x42d);
  while( true ) {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || (srcBasePtr == (void *)0x0)) break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      varType = (VarType *)0x0;
      while( true ) {
        pVVar6 = (VarType *)
                 std::
                 vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                 ::size(&(this->super_ShaderExecutor).m_outputs);
        if (pVVar6 <= varType) break;
        pvVar7 = std::
                 vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                 ::operator[](&(this->super_ShaderExecutor).m_outputs,(size_type)varType);
        layout_00 = std::
                    vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                    ::operator[](&this->m_outputLayout,(size_type)varType);
        copyFromBuffer(&pvVar7->varType,layout_00,numValues,srcBasePtr,outputPtrs[(long)varType]);
        varType = (VarType *)((long)&varType->m_type + 1);
      }
      (**(code **)(lVar5 + 0x1670))(0x90d2);
      dVar2 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar2,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x442);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"mapPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
             ,0x42e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BufferIoExecutor::readOutputBuffer (void* const* outputPtrs, int numValues)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	const deUint32			buffer				= *m_outputBuffer;
	const deUint32			outputStride		= getLayoutStride(m_outputLayout);
	const int				outputBufferSize	= numValues*outputStride;

	DE_ASSERT(outputBufferSize > 0); // At least some outputs are required.

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffer);
	void* mapPtr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, outputBufferSize, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
	TCU_CHECK(mapPtr);

	try
	{
		DE_ASSERT(m_outputs.size() == m_outputLayout.size());
		for (size_t outputNdx = 0; outputNdx < m_outputs.size(); ++outputNdx)
		{
			const glu::VarType&		varType		= m_outputs[outputNdx].varType;
			const VarLayout&		layout		= m_outputLayout[outputNdx];

			copyFromBuffer(varType, layout, numValues, mapPtr, outputPtrs[outputNdx]);
		}
	}
	catch (...)
	{
		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		throw;
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
}